

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintChoiceStats(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int level;
  Gia_Man_t *pGVar3;
  uint uVar4;
  uint uVar5;
  int v;
  long lVar6;
  
  pGVar3 = p;
  Gia_ManMarkFanoutDrivers(p);
  uVar2 = 0;
  uVar5 = 0;
  for (lVar6 = 0; level = (int)pGVar3, lVar6 < p->nObjs; lVar6 = lVar6 + 1) {
    v = (int)lVar6;
    pGVar3 = p;
    pGVar1 = Gia_ManObj(p,v);
    level = (int)pGVar3;
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    uVar4 = (uint)*(undefined8 *)pGVar1;
    if ((((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) && (p->pSibls != (int *)0x0)) &&
       (p->pSibls[lVar6] != 0)) {
      pGVar1 = Gia_ObjSiblObj(p,v);
      if ((pGVar1->field_0x3 & 0x40) != 0) {
        __assert_fail("!Gia_ObjSiblObj(p, i)->fMark0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x19c,"void Gia_ManPrintChoiceStats(Gia_Man_t *)");
      }
      pGVar3 = p;
      pGVar1 = Gia_ObjSiblObj(p,v);
      if (((int)(uint)*(undefined8 *)pGVar1 < 0) ||
         (((uint)*(undefined8 *)pGVar1 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(Gia_ObjSiblObj(p, i))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x19d,"void Gia_ManPrintChoiceStats(Gia_Man_t *)");
      }
      uVar5 = (uVar4 >> 0x1e) + uVar5;
      uVar2 = uVar2 + 1;
    }
  }
  Abc_Print(level,"Choice stats: Equivs =%7d. Choices =%7d.\n",(ulong)uVar2,(ulong)uVar5);
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManPrintChoiceStats( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nEquivs = 0, nChoices = 0;
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjSibl(p, i) )
            continue;
        nEquivs++;
        if ( pObj->fMark0 )
            nChoices++;
        assert( !Gia_ObjSiblObj(p, i)->fMark0 );
        assert( Gia_ObjIsAnd(Gia_ObjSiblObj(p, i)) );
    }
    Abc_Print( 1, "Choice stats: Equivs =%7d. Choices =%7d.\n", nEquivs, nChoices );
    Gia_ManCleanMark0( p );
}